

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_undo(int param_1,Fl_Text_Editor *e)

{
  int iVar1;
  Fl_When FVar2;
  Fl_Text_Buffer *pFVar3;
  int local_1c;
  int ret;
  int crsr;
  Fl_Text_Editor *e_local;
  int param_0_local;
  
  _ret = e;
  e_local._4_4_ = param_1;
  pFVar3 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  Fl_Text_Buffer::unselect(pFVar3);
  Fl::copy((EVP_PKEY_CTX *)0x28311c,(EVP_PKEY_CTX *)0x0);
  pFVar3 = Fl_Text_Display::buffer(&_ret->super_Fl_Text_Display);
  iVar1 = Fl_Text_Buffer::undo(pFVar3,&local_1c);
  Fl_Text_Display::insert_position(&_ret->super_Fl_Text_Display,local_1c);
  Fl_Text_Display::show_insert_position(&_ret->super_Fl_Text_Display);
  Fl_Widget::set_changed((Fl_Widget *)_ret);
  FVar2 = Fl_Widget::when((Fl_Widget *)_ret);
  if ((FVar2 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
    Fl_Widget::do_callback((Fl_Widget *)_ret);
  }
  return iVar1;
}

Assistant:

int Fl_Text_Editor::kf_undo(int , Fl_Text_Editor* e) {
  e->buffer()->unselect();
  Fl::copy("", 0, 0);
  int crsr;
  int ret = e->buffer()->undo(&crsr);
  e->insert_position(crsr);
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return ret;
}